

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<bool>::Iterator::Current(Iterator *this)

{
  bool *pbVar1;
  
  if ((this->value_)._M_t.super___uniq_ptr_impl<const_bool,_std::default_delete<const_bool>_>._M_t.
      super__Tuple_impl<0UL,_const_bool_*,_std::default_delete<const_bool>_>.
      super__Head_base<0UL,_const_bool_*,_false>._M_head_impl == (bool *)0x0) {
    pbVar1 = (bool *)operator_new(1);
    *pbVar1 = (*(this->iterator_).super__Bit_iterator_base._M_p >>
               ((ulong)(this->iterator_).super__Bit_iterator_base._M_offset & 0x3f) & 1) != 0;
    (this->value_)._M_t.super___uniq_ptr_impl<const_bool,_std::default_delete<const_bool>_>._M_t.
    super__Tuple_impl<0UL,_const_bool_*,_std::default_delete<const_bool>_>.
    super__Head_base<0UL,_const_bool_*,_false>._M_head_impl = pbVar1;
  }
  return (this->value_)._M_t.super___uniq_ptr_impl<const_bool,_std::default_delete<const_bool>_>.
         _M_t.super__Tuple_impl<0UL,_const_bool_*,_std::default_delete<const_bool>_>.
         super__Head_base<0UL,_const_bool_*,_false>._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }